

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall VBW::ConvexCell::kill_vertex(ConvexCell *this,index_t v)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  pointer pTVar4;
  index_t t;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  
  uVar2 = this->nb_t_;
  pTVar4 = (this->t_).
           super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
           .
           super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    uVar3._0_2_ = pTVar4[uVar5].super_Triangle.i;
    uVar3._2_2_ = pTVar4[uVar5].super_Triangle.j;
    uVar1 = pTVar4[uVar5].super_Triangle.k;
    uVar7 = uVar3;
    if ((uVar3 & 0xffff) == v) {
      uVar7 = 0;
    }
    uVar6 = 0;
    if (((uint)(CONCAT24(uVar1,uVar3) >> 0x10) & 0xffff) != v) {
      uVar6 = uVar3._2_2_;
    }
    uVar8 = 0;
    if (uVar1 != v) {
      uVar8 = uVar1;
    }
    pTVar4[uVar5].super_Triangle.i = (short)uVar7;
    pTVar4[uVar5].super_Triangle.j = uVar6;
    pTVar4[uVar5].super_Triangle.k = uVar8;
  }
  return;
}

Assistant:

void ConvexCell::kill_vertex(index_t v) {
	for(index_t t=0; t<nb_t(); ++t) {
	    Triangle T = get_triangle(t);
	    if(T.i == v) {
		T.i = VERTEX_AT_INFINITY;
	    }
	    if(T.j == v) {
		T.j = VERTEX_AT_INFINITY;
	    }
	    if(T.k == v) {
		T.k = VERTEX_AT_INFINITY;
	    }
	    t_[t].i = T.i;
	    t_[t].j = T.j;
	    t_[t].k = T.k;	    
	}
    }